

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

int rnd_class(int first,int last)

{
  int iVar1;
  int local_20;
  int local_1c;
  int sum;
  int x;
  int i;
  int last_local;
  int first_local;
  
  local_20 = 0;
  sum = first;
  last_local = first;
  if (first != last) {
    for (; sum <= last; sum = sum + 1) {
      local_20 = objects[sum].oc_prob + local_20;
    }
    if (local_20 == 0) {
      iVar1 = rn2((last - first) + 1);
      last_local = first + iVar1;
    }
    else {
      local_1c = rnd(local_20);
      for (sum = first; sum <= last; sum = sum + 1) {
        if ((objects[sum].oc_prob != 0) &&
           (local_1c = local_1c - objects[sum].oc_prob, local_1c < 1)) {
          return sum;
        }
      }
      last_local = 0;
    }
  }
  return last_local;
}

Assistant:

int rnd_class(int first, int last)
{
	int i, x, sum=0;

	if (first == last)
	    return first;
	for (i=first; i<=last; i++)
		sum += objects[i].oc_prob;
	if (!sum) /* all zero */
		return first + rn2(last-first+1);
	x = rnd(sum);
	for (i=first; i<=last; i++)
		if (objects[i].oc_prob && (x -= objects[i].oc_prob) <= 0)
			return i;
	return 0;
}